

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

void __thiscall
despot::MemoryPool<despot::RegDemoState>::Free
          (MemoryPool<despot::RegDemoState> *this,RegDemoState *obj)

{
  pointer *pppRVar1;
  iterator __position;
  RegDemoState *local_10;
  
  local_10 = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    __position._M_current =
         (this->freelist_).
         super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<despot::RegDemoState*,std::allocator<despot::RegDemoState*>>::
      _M_realloc_insert<despot::RegDemoState*const&>
                ((vector<despot::RegDemoState*,std::allocator<despot::RegDemoState*>> *)
                 &this->freelist_,__position,&local_10);
    }
    else {
      *__position._M_current = obj;
      pppRVar1 = &(this->freelist_).
                  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppRVar1 = *pppRVar1 + 1;
    }
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::RegDemoState>::Free(T *) [T = despot::RegDemoState]"
               );
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}